

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O0

void __thiscall
Diligent::SPIRVShaderResources::MapHLSLVertexShaderInputs
          (SPIRVShaderResources *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *SPIRV)

{
  char cVar1;
  undefined *puVar2;
  bool bVar3;
  Uint32 UVar4;
  int iVar5;
  Char *Message;
  SPIRVShaderStageInputAttribs *Args;
  undefined8 uVar6;
  long lVar7;
  reference pvVar8;
  undefined4 in_stack_ffffffffffffff18;
  value_type in_stack_ffffffffffffff1c;
  value_type vVar9;
  undefined1 local_b0 [8];
  string _msg_1;
  char *pcStack_88;
  uint32_t Location;
  char *EndPtr;
  string _msg;
  char *p;
  char *s;
  SPIRVShaderStageInputAttribs *Input;
  Uint32 i;
  undefined1 local_38 [8];
  string msg;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *SPIRV_local;
  SPIRVShaderResources *this_local;
  
  msg.field_2._8_8_ = SPIRV;
  bVar3 = IsHLSLSource(this);
  if (!bVar3) {
    FormatString<char[45]>
              ((string *)local_38,(char (*) [45])"This method is only relevant for HLSL source");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"MapHLSLVertexShaderInputs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x336);
    std::__cxx11::string::~string((string *)local_38);
  }
  Input._0_4_ = 0;
  while( true ) {
    UVar4 = GetNumShaderStageInputs(this);
    if (UVar4 <= (uint)Input) break;
    Args = GetShaderStageInputAttribs(this,(uint)Input);
    p = Args->Semantic;
    _msg.field_2._8_8_ = MapHLSLVertexShaderInputs::Prefix;
    vVar9 = in_stack_ffffffffffffff1c;
    while( true ) {
      bVar3 = false;
      if ((*p != '\0') && (bVar3 = false, *(char *)_msg.field_2._8_8_ != '\0')) {
        cVar1 = *(char *)_msg.field_2._8_8_;
        iVar5 = tolower((uint)(byte)*p);
        bVar3 = cVar1 == iVar5;
      }
      if (!bVar3) break;
      _msg.field_2._8_8_ = _msg.field_2._8_8_ + 1;
      p = p + 1;
    }
    if (*(char *)_msg.field_2._8_8_ == '\0') {
      pcStack_88 = (char *)0x0;
      lVar7 = strtol(p,&stack0xffffffffffffff78,10);
      in_stack_ffffffffffffff1c = (value_type)lVar7;
      _msg_1.field_2._12_4_ = in_stack_ffffffffffffff1c;
      if (*pcStack_88 == '\0') {
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)msg.field_2._8_8_
                            ,(ulong)Args->LocationDecorationOffset);
        *pvVar8 = in_stack_ffffffffffffff1c;
      }
      else {
        FormatString<char[25],char_const*,char[43],char_const*,char[11]>
                  ((string *)local_b0,(Diligent *)"Unable to map semantic \'",(char (*) [25])Args,
                   (char **)"\' to input location: semantics must have \'",
                   (char (*) [43])&MapHLSLVertexShaderInputs::Prefix,(char **)"x\' format.",
                   (char (*) [11])CONCAT44(vVar9,in_stack_ffffffffffffff18));
        puVar2 = DebugMessageCallback;
        in_stack_ffffffffffffff1c = vVar9;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar6 = std::__cxx11::string::c_str();
          (*(code *)puVar2)(2,uVar6,0);
          in_stack_ffffffffffffff1c = vVar9;
        }
        std::__cxx11::string::~string((string *)local_b0);
      }
    }
    else {
      FormatString<char[25],char_const*,char[43],char_const*,char[11]>
                ((string *)&EndPtr,(Diligent *)"Unable to map semantic \'",(char (*) [25])Args,
                 (char **)"\' to input location: semantics must have \'",
                 (char (*) [43])&MapHLSLVertexShaderInputs::Prefix,(char **)"x\' format.",
                 (char (*) [11])CONCAT44(vVar9,in_stack_ffffffffffffff18));
      puVar2 = DebugMessageCallback;
      in_stack_ffffffffffffff1c = vVar9;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar6 = std::__cxx11::string::c_str();
        (*(code *)puVar2)(2,uVar6,0);
        in_stack_ffffffffffffff1c = vVar9;
      }
      std::__cxx11::string::~string((string *)&EndPtr);
    }
    Input._0_4_ = (uint)Input + 1;
  }
  return;
}

Assistant:

void SPIRVShaderResources::MapHLSLVertexShaderInputs(std::vector<uint32_t>& SPIRV) const
{
    VERIFY(IsHLSLSource(), "This method is only relevant for HLSL source");

    for (Uint32 i = 0; i < GetNumShaderStageInputs(); ++i)
    {
        const SPIRVShaderStageInputAttribs& Input = GetShaderStageInputAttribs(i);

        const char*        s      = Input.Semantic;
        static const char* Prefix = "attrib";
        const char*        p      = Prefix;
        while (*s != 0 && *p != 0 && *p == std::tolower(static_cast<unsigned char>(*s)))
        {
            ++p;
            ++s;
        }

        if (*p != 0)
        {
            LOG_ERROR_MESSAGE("Unable to map semantic '", Input.Semantic, "' to input location: semantics must have '", Prefix, "x' format.");
            continue;
        }

        char*    EndPtr   = nullptr;
        uint32_t Location = static_cast<uint32_t>(strtol(s, &EndPtr, 10));
        if (*EndPtr != 0)
        {
            LOG_ERROR_MESSAGE("Unable to map semantic '", Input.Semantic, "' to input location: semantics must have '", Prefix, "x' format.");
            continue;
        }
        SPIRV[Input.LocationDecorationOffset] = Location;
    }
}